

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QList<QString>>::emplace<QList<QString>>
          (QMovableArrayOps<QList<QString>> *this,qsizetype i,QList<QString> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  QString *pQVar6;
  qsizetype qVar7;
  long lVar8;
  longlong __old_val_5;
  QTypedArrayData<QString> *__old_val;
  QString *__old_val_1;
  longlong __old_val_2;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0010df1d:
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    pDVar5 = (args->d).d;
    pQVar6 = (args->d).ptr;
    (args->d).d = (Data *)0x0;
    (args->d).ptr = (QString *)0x0;
    qVar7 = (args->d).size;
    (args->d).size = 0;
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<QList<QString>_>::detachAndGrow
              ((QArrayDataPointer<QList<QString>_> *)this,(uint)(i == 0 && lVar3 != 0),1,
               (QList<QString> **)0x0,(QArrayDataPointer<QList<QString>_> *)0x0);
    lVar8 = *(long *)(this + 8);
    if (i == 0 && lVar3 != 0) {
      *(Data **)(lVar8 + -0x18) = pDVar5;
      *(QString **)(lVar8 + -0x10) = pQVar6;
      *(qsizetype *)(lVar8 + -8) = qVar7;
      *(long *)(this + 8) = lVar8 + -0x18;
    }
    else {
      puVar1 = (undefined8 *)(lVar8 + i * 0x18);
      memmove(puVar1 + 3,(void *)(lVar8 + i * 0x18),(*(long *)(this + 0x10) - i) * 0x18);
      *puVar1 = pDVar5;
      puVar1[1] = pQVar6;
      puVar1[2] = qVar7;
    }
    local_58.size = 0;
    local_58.ptr = (QString *)0x0;
    local_58.d = (Data *)0x0;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) - i !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) * -0x5555555555555555)) {
      pDVar5 = (args->d).d;
      (args->d).d = (Data *)0x0;
      *(Data **)(lVar3 + i * 0x18) = pDVar5;
      pQVar6 = (args->d).ptr;
      (args->d).ptr = (QString *)0x0;
      *(QString **)(lVar3 + 8 + i * 0x18) = pQVar6;
      qVar7 = (args->d).size;
      (args->d).size = 0;
      *(qsizetype *)(lVar3 + 0x10 + i * 0x18) = qVar7;
    }
    else {
      if ((i != 0) ||
         (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar4))
      goto LAB_0010df1d;
      pDVar5 = (args->d).d;
      (args->d).d = (Data *)0x0;
      *(Data **)(uVar4 - 0x18) = pDVar5;
      pQVar6 = (args->d).ptr;
      (args->d).ptr = (QString *)0x0;
      *(QString **)(uVar4 - 0x10) = pQVar6;
      qVar7 = (args->d).size;
      (args->d).size = 0;
      *(qsizetype *)(uVar4 - 8) = qVar7;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }